

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O0

int lz77_init(LZ77Context *ctx)

{
  LZ77InternalContext *pLVar1;
  int local_24;
  int i;
  LZ77InternalContext *st;
  LZ77Context *ctx_local;
  
  pLVar1 = (LZ77InternalContext *)safemalloc(1,0x38ffc,0);
  if (pLVar1 == (LZ77InternalContext *)0x0) {
    ctx_local._4_4_ = 0;
  }
  else {
    ctx->ictx = pLVar1;
    for (local_24 = 0; local_24 < 0x8000; local_24 = local_24 + 1) {
      pLVar1->win[local_24].hashval = -1;
      pLVar1->win[local_24].prev = -1;
      pLVar1->win[local_24].next = -1;
    }
    for (local_24 = 0; local_24 < 0x7f7; local_24 = local_24 + 1) {
      pLVar1->hashtab[local_24].first = -1;
    }
    pLVar1->winpos = 0;
    pLVar1->npending = 0;
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

static int lz77_init(struct LZ77Context *ctx)
{
    struct LZ77InternalContext *st;
    int i;

    st = snew(struct LZ77InternalContext);
    if (!st)
        return 0;

    ctx->ictx = st;

    for (i = 0; i < WINSIZE; i++)
        st->win[i].next = st->win[i].prev = st->win[i].hashval = INVALID;
    for (i = 0; i < HASHMAX; i++)
        st->hashtab[i].first = INVALID;
    st->winpos = 0;

    st->npending = 0;

    return 1;
}